

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddCount.c
# Opt level: O1

int Cudd_zddCount(DdManager *zdd,DdNode *P)

{
  DdNode *base;
  DdNode *empty;
  int iVar1;
  st__table *table;
  
  base = zdd->one;
  empty = zdd->zero;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = cuddZddCountStep(P,table,base,empty);
    if (iVar1 == -1) {
      zdd->errorCode = CUDD_MEMORY_OUT;
    }
    st__foreach(table,st__zdd_countfree,(char *)0x0);
    st__free_table(table);
  }
  return iVar1;
}

Assistant:

int
Cudd_zddCount(
  DdManager * zdd,
  DdNode * P)
{
    st__table    *table;
    int         res;
    DdNode      *base, *empty;

    base  = DD_ONE(zdd);
    empty = DD_ZERO(zdd);
    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) return(CUDD_OUT_OF_MEM);
    res = cuddZddCountStep(P, table, base, empty);
    if (res == CUDD_OUT_OF_MEM) {
        zdd->errorCode = CUDD_MEMORY_OUT;
    }
    st__foreach(table, st__zdd_countfree, NIL(char));
    st__free_table(table);

    return(res);

}